

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzskylmat.cpp
# Opt level: O3

int __thiscall
TPZSkylMatrix<double>::Resize(TPZSkylMatrix<double> *this,int64_t newDim,int64_t param_2)

{
  double **ppdVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long lVar3;
  undefined4 extraout_var_01;
  
  iVar2 = (*(this->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
            [0xc])();
  if (CONCAT44(extraout_var,iVar2) != newDim) {
    TPZVec<double_*>::Resize(&this->fElem,newDim + 1);
    iVar2 = (*(this->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
              [0xc])(this);
    if (CONCAT44(extraout_var_00,iVar2) <= newDim) {
      iVar2 = (*(this->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable.
                _vptr_TPZSavable[0xc])(this);
      lVar3 = CONCAT44(extraout_var_01,iVar2);
      if (lVar3 < newDim) {
        do {
          ppdVar1 = (this->fElem).fStore;
          ppdVar1[lVar3 + 1] = ppdVar1[lVar3];
          lVar3 = lVar3 + 1;
        } while (newDim != lVar3);
      }
    }
    ppdVar1 = (this->fElem).fStore;
    TPZVec<double>::Resize(&this->fStorage,(long)ppdVar1[newDim] - (long)*ppdVar1 >> 3);
    (this->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol = newDim;
    (this->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow = newDim;
    (this->super_TPZMatrix<double>).super_TPZBaseMatrix.fDecomposed = '\0';
  }
  return 1;
}

Assistant:

int TPZSkylMatrix<TVar>::Resize( int64_t newDim ,int64_t ) {
	if ( newDim == this->Dim() )
		return( 1 );
	
	fElem.Resize(newDim+1);
	// Cria nova matrix.
	
	// Copia os elementos para a nova matriz.
	int64_t min = MIN( newDim, this->Dim() );
	int64_t i;
	for ( i = min+1; i <= newDim; i++ )
		fElem[i] = fElem[i-1];
	
	// Zera as posicoes que sobrarem (se sobrarem)
	fStorage.Resize(fElem[newDim]-fElem[0]);
	this->fRow = this->fCol = newDim;
	this->fDecomposed = 0;
	return( 1 );
}